

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void __thiscall CVmObjString::cons_shrink_buffer(CVmObjString *this,char *ptr)

{
  int iVar1;
  size_t sVar2;
  CVmVarHeap *pCVar3;
  undefined4 extraout_var;
  long lVar4;
  long in_RSI;
  char *in_RDI;
  size_t siz;
  size_t in_stack_ffffffffffffffd8;
  
  lVar4 = in_RSI - (*(long *)(in_RDI + 8) + 2);
  sVar2 = vmb_get_len("H+D$\x10H=");
  if (0xff < sVar2 - lVar4) {
    pCVar3 = CVmMemory::get_var_heap(G_mem_X);
    iVar1 = (*pCVar3->_vptr_CVmVarHeap[5])(pCVar3,lVar4 + 2,*(undefined8 *)(in_RDI + 8));
    *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  }
  vmb_put_len(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void CVmObjString::cons_shrink_buffer(VMG_ char *ptr)
{
    /* figure the offset of the pointer into the current buffer */
    size_t siz = (size_t)(ptr - (ext_ + VMB_LEN));

    /* 
     *   If the savings are substantial enough, reallocate.  If the size is
     *   unchanged, or it's within a reasonable margin of the target size, do
     *   nothing.  Reallocation isn't free (we have to find memory and make a
     *   copy of the current buffer), so it's more efficient to waste a
     *   little memory if the savings are substantial.  
     */
    if (vmb_get_len(ext_) - siz >= 256)
    {
        /* reallocate at the new size */
        ext_ = (char *)G_mem->get_var_heap()->realloc_mem(
            siz + VMB_LEN, ext_, this);
    }

    /* write the final length */
    vmb_put_len(ext_, siz);
}